

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O1

void __thiscall CorUnix::CThreadSuspensionInfo::WaitOnSuspendSemaphore(CThreadSuspensionInfo *this)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  
  iVar1 = sem_wait((sem_t *)&this->m_semSusp);
  while (iVar1 == -1) {
    fprintf(_stderr,"] %s %s:%d","WaitOnSuspendSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0x267);
    __stream = _stderr;
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    pcVar3 = strerror(__errnum);
    fprintf(__stream,"sem_wait returned -1 and set errno to %d (%s)\n",(ulong)__errnum,pcVar3);
    iVar1 = sem_wait((sem_t *)&this->m_semSusp);
  }
  return;
}

Assistant:

void
CThreadSuspensionInfo::WaitOnSuspendSemaphore()
{
#if USE_POSIX_SEMAPHORES
    while (sem_wait(&m_semSusp) == -1)
    {
        ASSERT("sem_wait returned -1 and set errno to %d (%s)\n", errno, strerror(errno));
    }
#elif USE_SYSV_SEMAPHORES
    while (semop(m_nSemsuspid, &m_sbSemwait, 1) == -1)
    {
        ASSERT("semop wait returned -1 and set errno to %d (%s)\n", errno, strerror(errno));
    }
#elif USE_PTHREAD_CONDVARS
    int status;

    // By the time we wait the target thread may have already signalled its suspension (in
    // which case m_fSuspended will be TRUE and we shouldn't wait on the cond var). But we
    // must check the flag and potentially wait atomically to avoid the race where we read
    // the flag and the target thread sets it and signals before we have a chance to wait.

    status = pthread_mutex_lock(&m_mutexSusp);
    if (status != 0)
    {
        ASSERT("pthread_mutex_lock returned %d (%s)\n", status, strerror(status));
    }

    // If the target has already acknowledged the suspend we shouldn't wait.
    while (!m_fSuspended)
    {
        // We got here before the target could signal. Wait on them (which atomically releases
        // the mutex during the wait).
        status = pthread_cond_wait(&m_condSusp, &m_mutexSusp);
        if (status != 0)
        {
            ASSERT("pthread_cond_wait returned %d (%s)\n", status, strerror(status));
        }
    }

    status = pthread_mutex_unlock(&m_mutexSusp);
    if (status != 0)
    {
        ASSERT("pthread_mutex_unlock returned %d (%s)\n", status, strerror(status));
    }
#endif // USE_POSIX_SEMAPHORES
}